

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

uint mg_check_feature(uint feature)

{
  return feature & 0x20000008;
}

Assistant:

CIVETWEB_API unsigned
mg_check_feature(unsigned feature)
{
	static const unsigned feature_set = 0
	/* Set bits for available features according to API documentation.
	 * This bit mask is created at compile time, according to the active
	 * preprocessor defines. It is a single const value at runtime. */
#if !defined(NO_FILES)
	                                    | MG_FEATURES_FILES
#endif
#if !defined(NO_SSL) || defined(USE_MBEDTLS)
	                                    | MG_FEATURES_SSL
#endif
#if !defined(NO_CGI)
	                                    | MG_FEATURES_CGI
#endif
#if defined(USE_IPV6)
	                                    | MG_FEATURES_IPV6
#endif
#if defined(USE_WEBSOCKET)
	                                    | MG_FEATURES_WEBSOCKET
#endif
#if defined(USE_LUA)
	                                    | MG_FEATURES_LUA
#endif
#if defined(USE_DUKTAPE)
	                                    | MG_FEATURES_SSJS
#endif
#if !defined(NO_CACHING)
	                                    | MG_FEATURES_CACHE
#endif
#if defined(USE_SERVER_STATS)
	                                    | MG_FEATURES_STATS
#endif
#if defined(USE_ZLIB)
	                                    | MG_FEATURES_COMPRESSION
#endif
#if defined(USE_HTTP2)
	                                    | MG_FEATURES_HTTP2
#endif
#if defined(USE_X_DOM_SOCKET)
	                                    | MG_FEATURES_X_DOMAIN_SOCKET
#endif

	/* Set some extra bits not defined in the API documentation.
	 * These bits may change without further notice. */
#if defined(MG_LEGACY_INTERFACE)
	                                    | 0x80000000u
#endif
#if defined(MG_EXPERIMENTAL_INTERFACES)
	                                    | 0x40000000u
#endif
#if !defined(NO_RESPONSE_BUFFERING)
	                                    | 0x20000000u
#endif
#if defined(MEMORY_DEBUGGING)
	                                    | 0x10000000u
#endif
	    ;
	return (feature & feature_set);
}